

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::ForceConstraintPS::execute
          (ForceConstraintPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  uint *puVar1;
  uint *puVar2;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *sv;
  undefined1 uVar3;
  undefined1 uVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  pointer pnVar8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar9;
  pointer pnVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int32_t iVar18;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  int iVar24;
  int iVar25;
  VarStatus VVar26;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar27;
  cpp_dec_float<50U,_int,_void> *pcVar28;
  ulong uVar29;
  cpp_dec_float<50U,_int,_void> *pcVar30;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar31;
  long lVar32;
  long lVar33;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  multiplier;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  basis_col;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  uint local_568;
  uint local_564;
  cpp_dec_float<50U,_int,_void> local_558;
  cpp_dec_float<50U,_int,_void> local_518;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4d8;
  int32_t local_4d0;
  fpclass_type local_4cc;
  cpp_dec_float<50U,_int,_void> local_4c8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_488;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_480;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_478;
  uint local_470;
  int local_46c;
  cpp_dec_float<50U,_int,_void> local_468;
  cpp_dec_float<50U,_int,_void> local_428;
  undefined1 local_3e8 [8];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  SStack_3e0;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNStack_3d0;
  uint local_3c8 [2];
  int local_3c0;
  bool local_3bc;
  undefined8 local_3b8;
  uint local_3a8 [2];
  uint auStack_3a0 [2];
  uint local_398 [2];
  undefined8 uStack_390;
  undefined8 local_388;
  cpp_dec_float<50U,_int,_void> local_378;
  cpp_dec_float<50U,_int,_void> local_338;
  cpp_dec_float<50U,_int,_void> local_2f8;
  uint local_2b8 [2];
  uint auStack_2b0 [2];
  uint local_2a8 [2];
  undefined8 uStack_2a0;
  undefined8 local_298;
  uint local_288 [2];
  uint auStack_280 [2];
  uint local_278;
  uint uStack_274;
  uint uStack_270;
  uint uStack_26c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_268;
  uint local_258 [2];
  uint auStack_250 [2];
  uint local_248;
  uint uStack_244;
  uint uStack_240;
  uint uStack_23c;
  undefined8 local_238;
  uint local_228 [2];
  uint auStack_220 [2];
  uint local_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  undefined8 local_208;
  uint local_1f8 [2];
  uint auStack_1f0 [2];
  uint local_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  undefined8 local_1d8;
  uint local_1c8 [2];
  uint auStack_1c0 [2];
  uint local_1b8 [2];
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  fpclass_type local_198;
  int32_t iStack_194;
  undefined8 uStack_190;
  uint local_180 [2];
  uint auStack_178 [2];
  uint local_170 [2];
  uint auStack_168 [2];
  uint local_160 [2];
  int local_158;
  byte local_154;
  fpclass_type local_150;
  int32_t iStack_14c;
  cpp_dec_float<50U,_int,_void> local_148;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  iVar25 = this->m_i;
  iVar24 = this->m_old_i;
  if (iVar25 != iVar24) {
    pnVar8 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar8[iVar24].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar8[iVar25].m_backend.data._M_elems + 8);
    uVar14 = *(undefined8 *)&pnVar8[iVar25].m_backend.data;
    uVar15 = *(undefined8 *)(pnVar8[iVar25].m_backend.data._M_elems + 2);
    puVar2 = pnVar8[iVar25].m_backend.data._M_elems + 4;
    uVar16 = *(undefined8 *)(puVar2 + 2);
    puVar1 = pnVar8[iVar24].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar1 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar1 + 2) = uVar16;
    *(undefined8 *)&pnVar8[iVar24].m_backend.data = uVar14;
    *(undefined8 *)(pnVar8[iVar24].m_backend.data._M_elems + 2) = uVar15;
    pnVar8[iVar24].m_backend.exp = pnVar8[iVar25].m_backend.exp;
    pnVar8[iVar24].m_backend.neg = pnVar8[iVar25].m_backend.neg;
    iVar18 = pnVar8[iVar25].m_backend.prec_elem;
    pnVar8[iVar24].m_backend.fpclass = pnVar8[iVar25].m_backend.fpclass;
    pnVar8[iVar24].m_backend.prec_elem = iVar18;
    iVar25 = this->m_i;
    pnVar8 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar24 = this->m_old_i;
    *(undefined8 *)(pnVar8[iVar24].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar8[iVar25].m_backend.data._M_elems + 8);
    uVar14 = *(undefined8 *)&pnVar8[iVar25].m_backend.data;
    uVar15 = *(undefined8 *)(pnVar8[iVar25].m_backend.data._M_elems + 2);
    puVar2 = pnVar8[iVar25].m_backend.data._M_elems + 4;
    uVar16 = *(undefined8 *)(puVar2 + 2);
    puVar1 = pnVar8[iVar24].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar1 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar1 + 2) = uVar16;
    *(undefined8 *)&pnVar8[iVar24].m_backend.data = uVar14;
    *(undefined8 *)(pnVar8[iVar24].m_backend.data._M_elems + 2) = uVar15;
    pnVar8[iVar24].m_backend.exp = pnVar8[iVar25].m_backend.exp;
    pnVar8[iVar24].m_backend.neg = pnVar8[iVar25].m_backend.neg;
    iVar18 = pnVar8[iVar25].m_backend.prec_elem;
    pnVar8[iVar24].m_backend.fpclass = pnVar8[iVar25].m_backend.fpclass;
    pnVar8[iVar24].m_backend.prec_elem = iVar18;
    rStatus->data[this->m_old_i] = rStatus->data[this->m_i];
  }
  iVar25 = this->m_i;
  pnVar8 = (s->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)(pnVar8[iVar25].m_backend.data._M_elems + 8) =
       *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 8);
  uVar14 = *(undefined8 *)(this->m_lRhs).m_backend.data._M_elems;
  uVar15 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 2);
  uVar16 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 6);
  puVar2 = pnVar8[iVar25].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 4);
  *(undefined8 *)(puVar2 + 2) = uVar16;
  *(undefined8 *)&pnVar8[iVar25].m_backend.data = uVar14;
  *(undefined8 *)(pnVar8[iVar25].m_backend.data._M_elems + 2) = uVar15;
  pnVar8[iVar25].m_backend.exp = (this->m_lRhs).m_backend.exp;
  pnVar8[iVar25].m_backend.neg = (this->m_lRhs).m_backend.neg;
  iVar18 = (this->m_lRhs).m_backend.prec_elem;
  pnVar8[iVar25].m_backend.fpclass = (this->m_lRhs).m_backend.fpclass;
  pnVar8[iVar25].m_backend.prec_elem = iVar18;
  local_2f8.fpclass = cpp_dec_float_finite;
  local_2f8.prec_elem = 10;
  local_2f8.data._M_elems[0] = 0;
  local_2f8.data._M_elems[1] = 0;
  local_2f8.data._M_elems[2] = 0;
  local_2f8.data._M_elems[3] = 0;
  local_2f8.data._M_elems[4] = 0;
  local_2f8.data._M_elems[5] = 0;
  local_2f8.data._M_elems._24_5_ = 0;
  local_2f8.data._M_elems[7]._1_3_ = 0;
  local_2f8.data._M_elems._32_5_ = 0;
  local_2f8.data._M_elems[9]._1_3_ = 0;
  local_2f8.exp = 0;
  local_2f8.neg = false;
  local_4d8 = r;
  local_488 = y;
  local_478 = x;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_2f8,-1.0);
  if ((this->m_row).
      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .memused < 1) {
    local_568 = 0xffffffff;
    local_564 = 0xffffffff;
  }
  else {
    local_564 = 0xffffffff;
    lVar31 = 0x30;
    lVar33 = 0x38;
    lVar32 = 0;
    local_568 = 0xffffffff;
    local_480 = cStatus;
    do {
      pNVar9 = (this->m_row).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      uVar7 = *(uint *)((long)(pNVar9->val).m_backend.data._M_elems + lVar33);
      local_3c8 = *(uint (*) [2])((long)(pNVar9->val).m_backend.data._M_elems + lVar33 + -0x18);
      puVar2 = (uint *)((long)(&pNVar9->val + -1) + lVar33);
      local_3e8 = *(undefined1 (*) [8])puVar2;
      SStack_3e0.m_elem =
           *(Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             **)(puVar2 + 2);
      puVar2 = (uint *)((long)(&(pNVar9->val).m_backend.data + -1) + lVar33);
      SStack_3e0.memsize = puVar2[0];
      SStack_3e0.memused = puVar2[1];
      pNStack_3d0 = *(Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      **)(puVar2 + 2);
      local_3c0 = *(int *)((long)(pNVar9->val).m_backend.data._M_elems + lVar33 + -0x10);
      local_3bc = *(bool *)((long)(pNVar9->val).m_backend.data._M_elems + lVar33 + -0xc);
      local_3b8 = *(undefined8 *)((long)(pNVar9->val).m_backend.data._M_elems + lVar33 + -8);
      pnVar8 = (this->m_oldLowers).data.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_388 = *(undefined8 *)((long)(pnVar8->m_backend).data._M_elems + lVar31 + -0x10);
      puVar2 = (uint *)((long)(pnVar8->m_backend).data._M_elems + lVar31 + -0x30);
      local_3a8 = *(uint (*) [2])puVar2;
      auStack_3a0 = *(uint (*) [2])(puVar2 + 2);
      puVar2 = (uint *)((long)(pnVar8->m_backend).data._M_elems + lVar31 + -0x20);
      local_398 = *(uint (*) [2])puVar2;
      uStack_390 = *(undefined8 *)(puVar2 + 2);
      iVar25 = *(int *)((long)(pnVar8->m_backend).data._M_elems + lVar31 + -8);
      uVar3 = *(undefined1 *)((long)(pnVar8->m_backend).data._M_elems + lVar31 + -4);
      pnVar10 = (this->m_oldUppers).data.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1a8 = *(undefined8 *)((long)(pnVar10->m_backend).data._M_elems + lVar31 + -0x10);
      puVar2 = (uint *)((long)(pnVar10->m_backend).data._M_elems + lVar31 + -0x30);
      local_1c8 = *(uint (*) [2])puVar2;
      auStack_1c0 = *(uint (*) [2])(puVar2 + 2);
      puVar2 = (uint *)((long)(pnVar10->m_backend).data._M_elems + lVar31 + -0x20);
      local_1b8 = *(uint (*) [2])puVar2;
      uStack_1b0 = *(undefined8 *)(puVar2 + 2);
      if ((cStatus->data[(int)uVar7] == FIXED) && ((this->m_fixed).data[lVar32] == true)) {
        local_46c = *(int *)((long)(pnVar10->m_backend).data._M_elems + lVar31 + -8);
        uVar4 = *(undefined1 *)((long)(pnVar10->m_backend).data._M_elems + lVar31 + -4);
        _local_198 = *(undefined8 *)((long)(pnVar10->m_backend).data._M_elems + lVar31);
        uStack_190 = 0;
        local_378.fpclass = cpp_dec_float_finite;
        local_378.prec_elem = 10;
        local_378.data._M_elems[0] = 0;
        local_378.data._M_elems[1] = 0;
        local_378.data._M_elems[2] = 0;
        local_378.data._M_elems[3] = 0;
        local_378.data._M_elems[4] = 0;
        local_378.data._M_elems[5] = 0;
        local_378.data._M_elems._24_5_ = 0;
        local_378.data._M_elems[7]._1_3_ = 0;
        local_378.data._M_elems._32_5_ = 0;
        local_378.data._M_elems[9]._1_3_ = 0;
        local_378.exp = 0;
        local_378.neg = false;
        local_4d0 = *(int32_t *)((long)(pnVar8->m_backend).data._M_elems + lVar31 + 4);
        local_4cc = *(fpclass_type *)((long)(pnVar8->m_backend).data._M_elems + lVar31);
        local_470 = uVar7;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_378,
                   &(local_4d8->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(int)uVar7].m_backend,
                   (cpp_dec_float<50U,_int,_void> *)local_3e8);
        local_428.data._M_elems[9]._1_3_ = local_378.data._M_elems[9]._1_3_;
        local_428.data._M_elems._32_5_ = local_378.data._M_elems._32_5_;
        local_428.data._M_elems[7]._1_3_ = local_378.data._M_elems[7]._1_3_;
        local_428.data._M_elems._24_5_ = local_378.data._M_elems._24_5_;
        local_428.data._M_elems[4] = local_378.data._M_elems[4];
        local_428.data._M_elems[5] = local_378.data._M_elems[5];
        local_428.data._M_elems[0] = local_378.data._M_elems[0];
        local_428.data._M_elems[1] = local_378.data._M_elems[1];
        uVar14 = local_428.data._M_elems._0_8_;
        local_428.data._M_elems[2] = local_378.data._M_elems[2];
        local_428.data._M_elems[3] = local_378.data._M_elems[3];
        local_428.exp = local_378.exp;
        local_428.neg = local_378.neg;
        local_428.fpclass = local_378.fpclass;
        local_428.prec_elem = local_378.prec_elem;
        if ((local_378.neg == true) &&
           (local_428.data._M_elems[0] = local_378.data._M_elems[0],
           local_378.fpclass != cpp_dec_float_finite || local_428.data._M_elems[0] != 0)) {
          local_428.neg = false;
        }
        pnVar8 = (local_478->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_1d8 = *(undefined8 *)(pnVar8[(int)uVar7].m_backend.data._M_elems + 8);
        local_1f8 = pnVar8[(int)uVar7].m_backend.data._M_elems[0];
        auStack_1f0 = *(uint (*) [2])(pnVar8[(int)uVar7].m_backend.data._M_elems + 2);
        puVar2 = pnVar8[(int)uVar7].m_backend.data._M_elems + 4;
        local_1e8 = *puVar2;
        uStack_1e4 = puVar2[1];
        uStack_1e0 = puVar2[2];
        uStack_1dc = puVar2[3];
        iVar24 = pnVar8[(int)uVar7].m_backend.exp;
        bVar5 = pnVar8[(int)uVar7].m_backend.neg;
        pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)(this->super_PostStep)._vptr_PostStep;
        uVar15._0_4_ = pnVar8[(int)uVar7].m_backend.fpclass;
        uVar15._4_4_ = pnVar8[(int)uVar7].m_backend.prec_elem;
        local_428.data._M_elems._0_8_ = uVar14;
        (**(code **)&(pnVar27->m_backend).fpclass)(&local_68,this);
        local_518.data._M_elems[0] = local_3a8[0];
        local_518.data._M_elems[1] = local_3a8[1];
        local_518.data._M_elems[2] = auStack_3a0[0];
        local_518.data._M_elems[3] = auStack_3a0[1];
        local_518.data._M_elems[4] = local_398[0];
        local_518.data._M_elems[5] = local_398[1];
        local_518.data._M_elems._24_5_ = SUB85(uStack_390,0);
        local_518.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_390 >> 0x28);
        local_518.data._M_elems._32_5_ = SUB85(local_388,0);
        local_518.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_388 >> 0x28);
        local_518.prec_elem = local_4d0;
        local_518.fpclass = local_4cc;
        local_4c8.data._M_elems[5] = uStack_1e4;
        local_4c8.data._M_elems[4] = local_1e8;
        local_4c8.data._M_elems[0] = local_1f8[0];
        local_4c8.data._M_elems[1] = local_1f8[1];
        local_4c8.data._M_elems[2] = auStack_1f0[0];
        local_4c8.data._M_elems[3] = auStack_1f0[1];
        local_4c8.data._M_elems._24_5_ = SUB85(CONCAT44(uStack_1dc,uStack_1e0),0);
        local_4c8.data._M_elems[7]._1_3_ = (undefined3)(uStack_1dc >> 8);
        local_4c8.data._M_elems._32_5_ = SUB85(local_1d8,0);
        local_4c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_1d8 >> 0x28);
        local_518.exp = iVar25;
        local_518.neg = (bool)uVar3;
        local_4c8.exp = iVar24;
        local_4c8.neg = bVar5;
        local_4c8._48_8_ = uVar15;
        relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_468,(soplex *)&local_518,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_4c8,pnVar27);
        cStatus = local_480;
        local_558.data._M_elems[4] = local_468.data._M_elems[4];
        local_558.data._M_elems[5] = local_468.data._M_elems[5];
        local_558.data._M_elems[0] = local_468.data._M_elems[0];
        local_558.data._M_elems[1] = local_468.data._M_elems[1];
        uVar14 = local_558.data._M_elems._0_8_;
        local_558.data._M_elems[2] = local_468.data._M_elems[2];
        local_558.data._M_elems[3] = local_468.data._M_elems[3];
        local_558.exp = local_468.exp;
        local_558.neg = local_468.neg;
        local_558.fpclass = local_468.fpclass;
        local_558.prec_elem = local_468.prec_elem;
        if ((local_468.neg == true) &&
           (local_558.data._M_elems[0] = local_468.data._M_elems[0],
           local_558.data._M_elems[0] != 0 || local_468.fpclass != cpp_dec_float_finite)) {
          local_558.neg = false;
        }
        VVar26 = ON_UPPER;
        local_558.data._M_elems._0_8_ = uVar14;
        if ((local_468.fpclass != cpp_dec_float_NaN) && (local_68.fpclass != cpp_dec_float_NaN)) {
          iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_558,&local_68);
          VVar26 = (VarStatus)(iVar24 < 1);
        }
        cStatus->data[(int)uVar7] = VVar26;
        if (((local_428.fpclass != cpp_dec_float_NaN) && (local_2f8.fpclass != cpp_dec_float_NaN))
           && (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_428,&local_2f8), 0 < iVar24)) {
          pnVar8 = (local_478->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_208 = *(undefined8 *)(pnVar8[(int)uVar7].m_backend.data._M_elems + 8);
          local_228 = pnVar8[(int)uVar7].m_backend.data._M_elems[0];
          auStack_220 = *(uint (*) [2])(pnVar8[(int)uVar7].m_backend.data._M_elems + 2);
          puVar2 = pnVar8[(int)uVar7].m_backend.data._M_elems + 4;
          local_218 = *puVar2;
          uStack_214 = puVar2[1];
          uStack_210 = puVar2[2];
          uStack_20c = puVar2[3];
          iVar24 = pnVar8[(int)uVar7].m_backend.exp;
          bVar5 = pnVar8[(int)uVar7].m_backend.neg;
          pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)(this->super_PostStep)._vptr_PostStep;
          uVar14._0_4_ = pnVar8[(int)uVar7].m_backend.fpclass;
          uVar14._4_4_ = pnVar8[(int)uVar7].m_backend.prec_elem;
          (**(code **)&(pnVar27->m_backend).fpclass)(&local_a0);
          local_518.data._M_elems[0] = local_3a8[0];
          local_518.data._M_elems[1] = local_3a8[1];
          local_518.data._M_elems[2] = auStack_3a0[0];
          local_518.data._M_elems[3] = auStack_3a0[1];
          local_518.data._M_elems[4] = local_398[0];
          local_518.data._M_elems[5] = local_398[1];
          local_518.data._M_elems._24_5_ = SUB85(uStack_390,0);
          local_518.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_390 >> 0x28);
          local_518.data._M_elems._32_5_ = SUB85(local_388,0);
          local_518.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_388 >> 0x28);
          local_518.prec_elem = local_4d0;
          local_518.fpclass = local_4cc;
          local_4c8.data._M_elems[5] = uStack_214;
          local_4c8.data._M_elems[4] = local_218;
          local_4c8.data._M_elems[0] = local_228[0];
          local_4c8.data._M_elems[1] = local_228[1];
          local_4c8.data._M_elems[2] = auStack_220[0];
          local_4c8.data._M_elems[3] = auStack_220[1];
          local_4c8.data._M_elems._24_5_ = SUB85(CONCAT44(uStack_20c,uStack_210),0);
          local_4c8.data._M_elems[7]._1_3_ = (undefined3)(uStack_20c >> 8);
          local_4c8.data._M_elems._32_5_ = SUB85(local_208,0);
          local_4c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_208 >> 0x28);
          local_518.exp = iVar25;
          local_518.neg = (bool)uVar3;
          local_4c8.exp = iVar24;
          local_4c8.neg = bVar5;
          local_4c8._48_8_ = uVar14;
          relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_468,(soplex *)&local_518,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_4c8,pnVar27);
          local_558.data._M_elems[4] = local_468.data._M_elems[4];
          local_558.data._M_elems[5] = local_468.data._M_elems[5];
          local_558.data._M_elems[0] = local_468.data._M_elems[0];
          local_558.data._M_elems[1] = local_468.data._M_elems[1];
          uVar14 = local_558.data._M_elems._0_8_;
          local_558.data._M_elems[2] = local_468.data._M_elems[2];
          local_558.data._M_elems[3] = local_468.data._M_elems[3];
          local_558.exp = local_468.exp;
          local_558.neg = local_468.neg;
          local_558.fpclass = local_468.fpclass;
          local_558.prec_elem = local_468.prec_elem;
          if ((local_468.neg == true) &&
             (local_558.data._M_elems[0] = local_468.data._M_elems[0],
             local_558.data._M_elems[0] != 0 || local_468.fpclass != cpp_dec_float_finite)) {
            local_558.neg = false;
          }
          local_558.data._M_elems._0_8_ = uVar14;
          uVar20 = local_338.data._M_elems._8_8_;
          uVar21 = local_338.data._M_elems._16_8_;
          uVar22 = local_338.data._M_elems._24_8_;
          uVar16 = local_338.data._M_elems._32_8_;
          uVar23 = local_338._48_8_;
          if (((local_468.fpclass == cpp_dec_float_NaN) || (local_a0.fpclass == cpp_dec_float_NaN))
             || (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_558,&local_a0), uVar20 = local_338.data._M_elems._8_8_,
                uVar21 = local_338.data._M_elems._16_8_, uVar22 = local_338.data._M_elems._24_8_,
                uVar16 = local_338.data._M_elems._32_8_, uVar23 = local_338._48_8_, 0 < iVar25)) {
LAB_003010ac:
            local_338._48_8_ = uVar23;
            local_338.data._M_elems._32_8_ = uVar16;
            local_338.data._M_elems._24_8_ = uVar22;
            local_338.data._M_elems._16_8_ = uVar21;
            local_338.data._M_elems._8_8_ = uVar20;
            pnVar8 = (local_478->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_238 = *(undefined8 *)(pnVar8[(int)uVar7].m_backend.data._M_elems + 8);
            local_258 = pnVar8[(int)uVar7].m_backend.data._M_elems[0];
            auStack_250 = *(uint (*) [2])(pnVar8[(int)uVar7].m_backend.data._M_elems + 2);
            puVar2 = pnVar8[(int)uVar7].m_backend.data._M_elems + 4;
            local_248 = *puVar2;
            uStack_244 = puVar2[1];
            uStack_240 = puVar2[2];
            uStack_23c = puVar2[3];
            iVar25 = pnVar8[(int)uVar7].m_backend.exp;
            bVar5 = pnVar8[(int)uVar7].m_backend.neg;
            pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)(this->super_PostStep)._vptr_PostStep;
            uVar11._0_4_ = pnVar8[(int)uVar7].m_backend.fpclass;
            uVar11._4_4_ = pnVar8[(int)uVar7].m_backend.prec_elem;
            (**(code **)&(pnVar27->m_backend).fpclass)(&local_d8);
            local_518.data._M_elems[0] = local_1c8[0];
            local_518.data._M_elems[1] = local_1c8[1];
            local_518.data._M_elems[2] = auStack_1c0[0];
            local_518.data._M_elems[3] = auStack_1c0[1];
            local_518.data._M_elems[4] = local_1b8[0];
            local_518.data._M_elems[5] = local_1b8[1];
            local_518.data._M_elems._24_5_ = SUB85(uStack_1b0,0);
            local_518.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_1b0 >> 0x28);
            local_518.data._M_elems._32_5_ = SUB85(local_1a8,0);
            local_518.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_1a8 >> 0x28);
            local_518.exp = local_46c;
            local_518.fpclass = local_198;
            local_518.prec_elem = iStack_194;
            local_4c8.data._M_elems[5] = uStack_244;
            local_4c8.data._M_elems[4] = local_248;
            local_4c8.data._M_elems[0] = local_258[0];
            local_4c8.data._M_elems[1] = local_258[1];
            local_4c8.data._M_elems[2] = auStack_250[0];
            local_4c8.data._M_elems[3] = auStack_250[1];
            local_4c8.data._M_elems._24_5_ = SUB85(CONCAT44(uStack_23c,uStack_240),0);
            local_4c8.data._M_elems[7]._1_3_ = (undefined3)(uStack_23c >> 8);
            local_4c8.data._M_elems._32_5_ = SUB85(local_238,0);
            local_4c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_238 >> 0x28);
            local_518.neg = (bool)uVar4;
            local_4c8.exp = iVar25;
            local_4c8.neg = bVar5;
            local_4c8._48_8_ = uVar11;
            relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_468,(soplex *)&local_518,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_4c8,pnVar27);
            cStatus = local_480;
            local_558.data._M_elems[4] = local_468.data._M_elems[4];
            local_558.data._M_elems[5] = local_468.data._M_elems[5];
            local_558.data._M_elems[0] = local_468.data._M_elems[0];
            local_558.data._M_elems[1] = local_468.data._M_elems[1];
            uVar14 = local_558.data._M_elems._0_8_;
            local_558.data._M_elems[2] = local_468.data._M_elems[2];
            local_558.data._M_elems[3] = local_468.data._M_elems[3];
            local_558.exp = local_468.exp;
            local_558.neg = local_468.neg;
            local_558.fpclass = local_468.fpclass;
            local_558.prec_elem = local_468.prec_elem;
            if ((local_468.neg == true) &&
               (local_558.data._M_elems[0] = local_468.data._M_elems[0],
               local_558.data._M_elems[0] != 0 || local_468.fpclass != cpp_dec_float_finite)) {
              local_558.neg = false;
            }
            local_558.data._M_elems._0_8_ = uVar14;
            if (((local_468.fpclass != cpp_dec_float_NaN) && (local_d8.fpclass != cpp_dec_float_NaN)
                ) && (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&local_558,&local_d8), iVar25 < 1)) {
              pnVar8 = (local_4d8->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              (*(this->super_PostStep)._vptr_PostStep[6])(&local_110,this);
              if (((pnVar8[(int)uVar7].m_backend.fpclass != cpp_dec_float_NaN) &&
                  (local_110.fpclass != cpp_dec_float_NaN)) &&
                 (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&pnVar8[(int)uVar7].m_backend,&local_110), 0 < iVar25))
              goto LAB_003013b0;
            }
          }
          else {
            pcVar28 = &(local_4d8->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(int)uVar7].m_backend;
            (*(this->super_PostStep)._vptr_PostStep[6])(local_180);
            uVar17._0_4_ = local_180[0];
            uVar17._4_4_ = local_180[1];
            uVar20._0_4_ = auStack_178[0];
            uVar20._4_4_ = auStack_178[1];
            uVar21._0_4_ = local_170[0];
            uVar21._4_4_ = local_170[1];
            uVar22._0_4_ = auStack_168[0];
            uVar22._4_4_ = auStack_168[1];
            local_338.data._M_elems[0] = local_180[0];
            local_338.data._M_elems[1] = local_180[1];
            uVar14 = local_338.data._M_elems._0_8_;
            local_338.data._M_elems[2] = auStack_178[0];
            local_338.data._M_elems[3] = auStack_178[1];
            uVar16._0_4_ = local_160[0];
            uVar16._4_4_ = local_160[1];
            local_338.data._M_elems[8] = local_160[0];
            local_338.data._M_elems[9] = local_160[1];
            local_338.data._M_elems[4] = local_170[0];
            local_338.data._M_elems[5] = local_170[1];
            local_338.data._M_elems[6] = auStack_168[0];
            local_338.data._M_elems[7] = auStack_168[1];
            local_338.exp = local_158;
            local_338.neg = (bool)local_154;
            uVar23._0_4_ = local_150;
            uVar23._4_4_ = iStack_14c;
            local_338.fpclass = local_150;
            local_338.prec_elem = iStack_14c;
            local_338.data._M_elems[0] = local_180[0];
            if (local_338.data._M_elems[0] != 0 || (fpclass_type)_local_150 != cpp_dec_float_finite)
            {
              local_338.neg = (bool)(local_154 ^ 1);
            }
            local_338.data._M_elems._0_8_ = uVar17;
            if ((((fpclass_type)_local_150 == cpp_dec_float_NaN) ||
                (local_338.data._M_elems._0_8_ = uVar14, uVar20 = local_338.data._M_elems._8_8_,
                uVar21 = local_338.data._M_elems._16_8_, uVar22 = local_338.data._M_elems._24_8_,
                uVar16 = local_338.data._M_elems._32_8_, uVar23 = local_338._48_8_,
                pcVar28->fpclass == cpp_dec_float_NaN)) ||
               (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar28,&local_338), cStatus = local_480,
               uVar20 = local_338.data._M_elems._8_8_, uVar21 = local_338.data._M_elems._16_8_,
               uVar22 = local_338.data._M_elems._24_8_, uVar16 = local_338.data._M_elems._32_8_,
               uVar23 = local_338._48_8_, -1 < iVar25)) goto LAB_003010ac;
LAB_003013b0:
            local_2f8.data._M_elems._32_5_ = local_428.data._M_elems._32_5_;
            local_2f8.data._M_elems[9]._1_3_ = local_428.data._M_elems[9]._1_3_;
            local_2f8.data._M_elems[0] = local_428.data._M_elems[0];
            local_2f8.data._M_elems[1] = local_428.data._M_elems[1];
            local_2f8.data._M_elems[2] = local_428.data._M_elems[2];
            local_2f8.data._M_elems[3] = local_428.data._M_elems[3];
            local_2f8.data._M_elems[4] = local_428.data._M_elems[4];
            local_2f8.data._M_elems[5] = local_428.data._M_elems[5];
            local_2f8.data._M_elems._24_5_ = local_428.data._M_elems._24_5_;
            local_2f8.data._M_elems[7]._1_3_ = local_428.data._M_elems[7]._1_3_;
            local_2f8.exp = local_428.exp;
            local_2f8.neg = local_428.neg;
            local_2f8.fpclass = local_428.fpclass;
            local_2f8.prec_elem = local_428.prec_elem;
            local_568 = (uint)lVar32;
            local_564 = local_470;
          }
        }
      }
      lVar32 = lVar32 + 1;
      lVar31 = lVar31 + 0x38;
      lVar33 = lVar33 + 0x3c;
    } while (lVar32 < (this->m_row).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  if ((int)local_564 < 0) {
    iVar25 = this->m_i;
    rStatus->data[iVar25] = BASIC;
    pnVar8 = (local_488->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar8[iVar25].m_backend.data._M_elems + 8) =
         *(undefined8 *)((this->m_rowobj).m_backend.data._M_elems + 8);
    uVar14 = *(undefined8 *)(this->m_rowobj).m_backend.data._M_elems;
    uVar15 = *(undefined8 *)((this->m_rowobj).m_backend.data._M_elems + 2);
    uVar16 = *(undefined8 *)((this->m_rowobj).m_backend.data._M_elems + 6);
    puVar2 = pnVar8[iVar25].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)((this->m_rowobj).m_backend.data._M_elems + 4);
    *(undefined8 *)(puVar2 + 2) = uVar16;
    *(undefined8 *)&pnVar8[iVar25].m_backend.data = uVar14;
    *(undefined8 *)(pnVar8[iVar25].m_backend.data._M_elems + 2) = uVar15;
    pnVar8[iVar25].m_backend.exp = (this->m_rowobj).m_backend.exp;
    pnVar8[iVar25].m_backend.neg = (this->m_rowobj).m_backend.neg;
    iVar18 = (this->m_rowobj).m_backend.prec_elem;
    pnVar8[iVar25].m_backend.fpclass = (this->m_rowobj).m_backend.fpclass;
    pnVar8[iVar25].m_backend.prec_elem = iVar18;
  }
  else {
    uVar29 = (ulong)local_564;
    cStatus->data[uVar29] = BASIC;
    pnVar27 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                **)((this->m_lRhs).m_backend.data._M_elems + 8);
    local_288 = *(uint (*) [2])(this->m_lRhs).m_backend.data._M_elems;
    auStack_280 = *(uint (*) [2])((this->m_lRhs).m_backend.data._M_elems + 2);
    local_278 = (this->m_lRhs).m_backend.data._M_elems[4];
    uStack_274 = (this->m_lRhs).m_backend.data._M_elems[5];
    uStack_270 = (this->m_lRhs).m_backend.data._M_elems[6];
    uStack_26c = (this->m_lRhs).m_backend.data._M_elems[7];
    iVar25 = (this->m_lRhs).m_backend.exp;
    bVar5 = (this->m_lRhs).m_backend.neg;
    local_298 = *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 8);
    local_2a8 = *(uint (*) [2])((this->m_lhs).m_backend.data._M_elems + 4);
    uStack_2a0 = *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 6);
    local_2b8 = *(uint (*) [2])(this->m_lhs).m_backend.data._M_elems;
    auStack_2b0 = *(uint (*) [2])((this->m_lhs).m_backend.data._M_elems + 2);
    iVar24 = (this->m_lhs).m_backend.exp;
    bVar6 = (this->m_lhs).m_backend.neg;
    uVar12._0_4_ = (this->m_lRhs).m_backend.fpclass;
    uVar12._4_4_ = (this->m_lRhs).m_backend.prec_elem;
    uVar13._0_4_ = (this->m_lhs).m_backend.fpclass;
    uVar13._4_4_ = (this->m_lhs).m_backend.prec_elem;
    local_268 = pnVar27;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_148);
    local_518.data._M_elems[5] = uStack_274;
    local_518.data._M_elems[4] = local_278;
    local_518.data._M_elems[0] = local_288[0];
    local_518.data._M_elems[1] = local_288[1];
    local_518.data._M_elems[2] = auStack_280[0];
    local_518.data._M_elems[3] = auStack_280[1];
    local_518.data._M_elems._24_5_ = SUB85(CONCAT44(uStack_26c,uStack_270),0);
    local_518.data._M_elems[7]._1_3_ = (undefined3)(uStack_26c >> 8);
    local_518.data._M_elems._32_5_ = SUB85(local_268,0);
    local_518.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_268 >> 0x28);
    local_4c8.data._M_elems[0] = local_2b8[0];
    local_4c8.data._M_elems[1] = local_2b8[1];
    local_4c8.data._M_elems[2] = auStack_2b0[0];
    local_4c8.data._M_elems[3] = auStack_2b0[1];
    local_4c8.data._M_elems[4] = local_2a8[0];
    local_4c8.data._M_elems[5] = local_2a8[1];
    local_4c8.data._M_elems._24_5_ = SUB85(uStack_2a0,0);
    local_4c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_2a0 >> 0x28);
    local_4c8.data._M_elems._32_5_ = SUB85(local_298,0);
    local_4c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_298 >> 0x28);
    local_518.exp = iVar25;
    local_518.neg = bVar5;
    local_518._48_8_ = uVar12;
    local_4c8.exp = iVar24;
    local_4c8.neg = bVar6;
    local_4c8._48_8_ = uVar13;
    relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_468,(soplex *)&local_518,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_4c8,pnVar27);
    local_558.data._M_elems[0] = local_468.data._M_elems[0];
    local_558.data._M_elems[1] = local_468.data._M_elems[1];
    uVar14 = local_558.data._M_elems._0_8_;
    local_558.data._M_elems[2] = local_468.data._M_elems[2];
    local_558.data._M_elems[3] = local_468.data._M_elems[3];
    local_558.data._M_elems[4] = local_468.data._M_elems[4];
    local_558.data._M_elems[5] = local_468.data._M_elems[5];
    local_558.exp = local_468.exp;
    local_558.neg = local_468.neg;
    local_558.fpclass = local_468.fpclass;
    local_558.prec_elem = local_468.prec_elem;
    if ((local_468.neg == true) &&
       (local_558.data._M_elems[0] = local_468.data._M_elems[0],
       local_558.data._M_elems[0] != 0 || local_468.fpclass != cpp_dec_float_finite)) {
      local_558.neg = false;
    }
    VVar26 = ON_UPPER;
    if ((local_468.fpclass != cpp_dec_float_NaN) && (local_148.fpclass != cpp_dec_float_NaN)) {
      local_558.data._M_elems._0_8_ = uVar14;
      iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_558,&local_148);
      VVar26 = (VarStatus)(iVar25 < 1);
    }
    pVVar19 = local_4d8;
    rStatus->data[this->m_i] = VVar26;
    pNVar9 = (this->m_row).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    lVar31 = (long)(int)local_568;
    local_558.data._M_elems._32_8_ = *(undefined8 *)(pNVar9[lVar31].val.m_backend.data._M_elems + 8)
    ;
    local_558.data._M_elems._0_8_ = *(undefined8 *)pNVar9[lVar31].val.m_backend.data._M_elems;
    local_558.data._M_elems._8_8_ = *(undefined8 *)(pNVar9[lVar31].val.m_backend.data._M_elems + 2);
    puVar2 = pNVar9[lVar31].val.m_backend.data._M_elems + 4;
    local_558.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_558.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    local_558.exp = pNVar9[lVar31].val.m_backend.exp;
    local_558.neg = pNVar9[lVar31].val.m_backend.neg;
    local_558.fpclass = pNVar9[lVar31].val.m_backend.fpclass;
    local_558.prec_elem = pNVar9[lVar31].val.m_backend.prec_elem;
    local_468.fpclass = cpp_dec_float_finite;
    local_468.prec_elem = 10;
    local_468.data._M_elems[0] = 0;
    local_468.data._M_elems[1] = 0;
    local_468.data._M_elems[2] = 0;
    local_468.data._M_elems[3] = 0;
    local_468.data._M_elems[4] = 0;
    local_468.data._M_elems[5] = 0;
    local_468.data._M_elems._24_5_ = 0;
    local_468.data._M_elems[7]._1_3_ = 0;
    local_468.data._M_elems._32_5_ = 0;
    local_468.data._M_elems[9]._1_3_ = 0;
    local_468.exp = 0;
    local_468.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_468,
               &(local_4d8->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar29].m_backend,&local_558);
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)
               ((pVVar19->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar29),0.0);
    if (0 < (this->m_row).
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused) {
      lVar32 = 0;
      uVar29 = 0;
      do {
        if (local_568 != uVar29) {
          pNVar9 = (this->m_row).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pcVar28 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)(pNVar9->val).m_backend.data._M_elems + lVar32);
          local_518.fpclass = cpp_dec_float_finite;
          local_518.prec_elem = 10;
          local_518.data._M_elems[0] = 0;
          local_518.data._M_elems[1] = 0;
          local_518.data._M_elems[2] = 0;
          local_518.data._M_elems[3] = 0;
          local_518.data._M_elems[4] = 0;
          local_518.data._M_elems[5] = 0;
          local_518.data._M_elems._24_5_ = 0;
          local_518.data._M_elems[7]._1_3_ = 0;
          local_518.data._M_elems._32_5_ = 0;
          local_518.data._M_elems[9]._1_3_ = 0;
          local_518.exp = 0;
          local_518.neg = false;
          if (pcVar28 != &local_518) {
            uVar14 = *(undefined8 *)((pcVar28->data)._M_elems + 8);
            local_518.data._M_elems._32_5_ = SUB85(uVar14,0);
            local_518.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
            local_518.data._M_elems._0_8_ = *(undefined8 *)(pcVar28->data)._M_elems;
            local_518.data._M_elems._8_8_ = *(undefined8 *)((pcVar28->data)._M_elems + 2);
            local_518.data._M_elems._16_8_ = *(undefined8 *)((pcVar28->data)._M_elems + 4);
            uVar14 = *(undefined8 *)((pcVar28->data)._M_elems + 6);
            local_518.data._M_elems._24_5_ = SUB85(uVar14,0);
            local_518.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
            local_518.exp = *(int *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar32);
            local_518.neg = *(bool *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar32 + 4);
            local_518._48_8_ =
                 *(undefined8 *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar32 + 8);
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_518,&local_468);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&(local_4d8->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [*(int *)((long)(&((this->m_row).
                                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .m_elem)->val + 1) + lVar32)].m_backend,&local_518);
        }
        uVar29 = uVar29 + 1;
        lVar32 = lVar32 + 0x3c;
      } while ((long)uVar29 <
               (long)(this->m_row).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused);
    }
    pnVar8 = (this->m_objs).data.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar14 = *(undefined8 *)(pnVar8[lVar31].m_backend.data._M_elems + 8);
    local_518.data._M_elems._32_5_ = SUB85(uVar14,0);
    local_518.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
    local_518.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[lVar31].m_backend.data;
    local_518.data._M_elems._8_8_ = *(undefined8 *)(pnVar8[lVar31].m_backend.data._M_elems + 2);
    puVar2 = pnVar8[lVar31].m_backend.data._M_elems + 4;
    local_518.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    uVar14 = *(undefined8 *)(puVar2 + 2);
    local_518.data._M_elems._24_5_ = SUB85(uVar14,0);
    local_518.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
    local_518.exp = pnVar8[lVar31].m_backend.exp;
    local_518.neg = pnVar8[lVar31].m_backend.neg;
    local_518.fpclass = pnVar8[lVar31].m_backend.fpclass;
    local_518.prec_elem = pnVar8[lVar31].m_backend.prec_elem;
    SStack_3e0.m_elem =
         (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    SStack_3e0.memsize = 0;
    SStack_3e0.memused = 0;
    local_3e8 = (undefined1  [8])&PTR__DSVectorBase_006adc40;
    pNStack_3d0 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0;
    sv = &(this->m_cols).data.
          super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar31].
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::allocMem((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)local_3e8,sv->memused);
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator=(&SStack_3e0,sv);
    if (0 < SStack_3e0.memused) {
      lVar32 = 0;
      lVar31 = 0;
      do {
        if (*(int *)((long)(&(SStack_3e0.m_elem)->val + 1) + lVar32) != this->m_i) {
          pcVar28 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)((SStack_3e0.m_elem)->val).m_backend.data._M_elems + lVar32);
          pcVar30 = &(local_488->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&(SStack_3e0.m_elem)->val + 1) + lVar32)].m_backend;
          local_4c8.fpclass = cpp_dec_float_finite;
          local_4c8.prec_elem = 10;
          local_4c8.data._M_elems[0] = 0;
          local_4c8.data._M_elems[1] = 0;
          local_4c8.data._M_elems[2] = 0;
          local_4c8.data._M_elems[3] = 0;
          local_4c8.data._M_elems[4] = 0;
          local_4c8.data._M_elems[5] = 0;
          local_4c8.data._M_elems._24_5_ = 0;
          local_4c8.data._M_elems[7]._1_3_ = 0;
          local_4c8.data._M_elems._32_5_ = 0;
          local_4c8.data._M_elems[9]._1_3_ = 0;
          local_4c8.exp = 0;
          local_4c8.neg = false;
          v = pcVar28;
          if ((&local_4c8 != pcVar30) && (v = pcVar30, pcVar28 != &local_4c8)) {
            uVar14 = *(undefined8 *)((pcVar28->data)._M_elems + 8);
            local_4c8.data._M_elems._32_5_ = SUB85(uVar14,0);
            local_4c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
            local_4c8.data._M_elems._0_8_ = *(undefined8 *)(pcVar28->data)._M_elems;
            local_4c8.data._M_elems._8_8_ = *(undefined8 *)((pcVar28->data)._M_elems + 2);
            local_4c8.data._M_elems._16_8_ = *(undefined8 *)((pcVar28->data)._M_elems + 4);
            uVar14 = *(undefined8 *)((pcVar28->data)._M_elems + 6);
            local_4c8.data._M_elems._24_5_ = SUB85(uVar14,0);
            local_4c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
            local_4c8.exp =
                 *(int *)((long)(&((SStack_3e0.m_elem)->val).m_backend.data + 1) + lVar32);
            local_4c8.neg =
                 *(bool *)((long)(&((SStack_3e0.m_elem)->val).m_backend.data + 1) + lVar32 + 4);
            local_4c8._48_8_ =
                 *(undefined8 *)
                  ((long)(&((SStack_3e0.m_elem)->val).m_backend.data + 1) + lVar32 + 8);
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_4c8,v);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_518,&local_4c8);
        }
        lVar31 = lVar31 + 1;
        lVar32 = lVar32 + 0x3c;
      } while (lVar31 < SStack_3e0.memused);
    }
    local_4c8.fpclass = cpp_dec_float_finite;
    local_4c8.prec_elem = 10;
    local_4c8.data._M_elems[0] = 0;
    local_4c8.data._M_elems[1] = 0;
    local_4c8.data._M_elems[2] = 0;
    local_4c8.data._M_elems[3] = 0;
    local_4c8.data._M_elems[4] = 0;
    local_4c8.data._M_elems[5] = 0;
    local_4c8.data._M_elems._24_5_ = 0;
    local_4c8.data._M_elems[7]._1_3_ = 0;
    local_4c8.data._M_elems._32_5_ = 0;
    local_4c8.data._M_elems[9]._1_3_ = 0;
    local_4c8.exp = 0;
    local_4c8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_4c8,&local_518,&local_558);
    iVar25 = this->m_i;
    pnVar8 = (local_488->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)(pnVar8[iVar25].m_backend.data._M_elems + 8) =
         CONCAT35(local_4c8.data._M_elems[9]._1_3_,local_4c8.data._M_elems._32_5_);
    puVar2 = pnVar8[iVar25].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = local_4c8.data._M_elems._16_8_;
    *(ulong *)(puVar2 + 2) =
         CONCAT35(local_4c8.data._M_elems[7]._1_3_,local_4c8.data._M_elems._24_5_);
    *(undefined8 *)&pnVar8[iVar25].m_backend.data = local_4c8.data._M_elems._0_8_;
    *(undefined8 *)(pnVar8[iVar25].m_backend.data._M_elems + 2) = local_4c8.data._M_elems._8_8_;
    pnVar8[iVar25].m_backend.exp = local_4c8.exp;
    pnVar8[iVar25].m_backend.neg = local_4c8.neg;
    pnVar8[iVar25].m_backend.fpclass = local_4c8.fpclass;
    pnVar8[iVar25].m_backend.prec_elem = local_4c8.prec_elem;
    local_3e8 = (undefined1  [8])&PTR__DSVectorBase_006adc40;
    if (pNStack_3d0 !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(pNStack_3d0);
    }
  }
  return;
}

Assistant:

void SPxMainSM<R>::ForceConstraintPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // primal:
   s[m_i] = m_lRhs;

   // basis:
   int cBasisCandidate = -1;
   R maxViolation = -1.0;
   int bas_k = -1;

   for(int k = 0; k < m_row.size(); ++k)
   {
      int  cIdx  = m_row.index(k);
      R aij   = m_row.value(k);
      R oldLo = m_oldLowers[k];
      R oldUp = m_oldUppers[k];

      switch(cStatus[cIdx])
      {
      case SPxSolverBase<R>::FIXED:
         if(m_fixed[k])
         {
            assert(EQrel(oldLo, x[cIdx], this->feastol()) || EQrel(oldUp, x[cIdx], this->feastol()));

            R violation = spxAbs(r[cIdx] / aij);

            cStatus[cIdx] = EQrel(oldLo, x[cIdx],
                                  this->feastol()) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;

            if(violation > maxViolation && ((EQrel(oldLo, x[cIdx], this->feastol())
                                             && r[cIdx] < -this->feastol())
                                            || (EQrel(oldUp, x[cIdx], this->feastol()) && r[cIdx] > this->feastol())))
            {
               maxViolation = violation;
               cBasisCandidate = cIdx;
               bas_k = k;
            }
         } // do nothing, if the old bounds are equal, i.e. variable has been not fixed in this row

         break;

      case SPxSolverBase<R>::ON_LOWER:
      case SPxSolverBase<R>::ON_UPPER:
      case SPxSolverBase<R>::BASIC:
         break;

      default:
         break;
      }
   }

   // dual and basis :
   if(cBasisCandidate >= 0)  // one of the variable in the row should in the basis
   {
      assert(EQrel(m_lRhs, m_rhs, this->feastol()) || EQrel(m_lRhs, m_lhs, this->feastol()));
      assert(bas_k >= 0);
      assert(cBasisCandidate == m_row.index(bas_k));

      cStatus[cBasisCandidate] = SPxSolverBase<R>::BASIC;
      rStatus[m_i] = (EQrel(m_lRhs, m_lhs,
                            this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;

      R aij = m_row.value(bas_k);
      R multiplier = r[cBasisCandidate] / aij;
      r[cBasisCandidate] = 0.0;

      for(int k = 0; k < m_row.size(); ++k)  // update the reduced cost
      {
         if(k == bas_k)
         {
            continue;
         }

         r[m_row.index(k)] -= m_row.value(k) * multiplier;
      }

      // compute the value of new dual variable (because we have a new row)
      R val = m_objs[bas_k];
      DSVectorBase<R> basis_col = m_cols[bas_k];

      for(int k = 0; k < basis_col.size(); ++k)
      {
         if(basis_col.index(k) != m_i)
            val -= basis_col.value(k) * y[basis_col.index(k)];
      }

      y[m_i] = val / aij;
   }
   else // slack in the basis
   {
      rStatus[m_i] = SPxSolverBase<R>::BASIC;
      y[m_i] = m_rowobj;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM18 Dimension doesn't match after this step.");
   }

#endif
}